

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parse2DArray<TgBot::PhotoSize>
          (string *__return_storage_ptr__,TgTypeParser *this,
          TgTypeToJsonFunc<TgBot::PhotoSize> parseFunc,
          vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
          *objects)

{
  bool bVar1;
  long lVar2;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  *in_R8;
  string local_98;
  reference local_78;
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
  *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  *__range2;
  allocator local_41;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  *local_40;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  *objects_local;
  TgTypeToJsonFunc<TgBot::PhotoSize> parseFunc_local;
  TgTypeParser *local_28;
  TgTypeParser *this_local;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  *local_18;
  string *local_10;
  string *result;
  
  local_40 = in_R8;
  objects_local =
       (vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
        *)parseFunc;
  parseFunc_local = (TgTypeToJsonFunc<TgBot::PhotoSize>)objects;
  local_28 = this;
  this_local = (TgTypeParser *)parseFunc;
  local_18 = objects;
  local_10 = __return_storage_ptr__;
  bVar1 = std::
          vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
          ::empty(in_R8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
    __end0 = std::
             vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
             ::begin(local_40);
    item = (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
            *)std::
              vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
              ::end(local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_*,_std::vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>_>
                                       *)&item), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<const_std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_*,_std::vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>_>
                 ::operator*(&__end0);
      parseArray<TgBot::PhotoSize>
                (&local_98,this,(TgTypeToJsonFunc<TgBot::PhotoSize>)objects_local,
                 (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                  *)parseFunc_local);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,',');
      __gnu_cxx::
      __normal_iterator<const_std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_*,_std::vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>_>
      ::operator++(&__end0);
    }
    lVar2 = std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar2 - 1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parse2DArray(TgTypeToJsonFunc<T> parseFunc, const std::vector<std::vector<std::shared_ptr<T>>>& objects) const {
        if (objects.empty())
            return "";
        std::string result;
        result += '[';
        for (const std::vector<std::shared_ptr<T>>& item : objects) {
            result += parseArray(parseFunc, item);
            result += ',';
        }
        result.erase(result.length() - 1);
        result += ']';
        return result;
    }